

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WabtInterface.cpp
# Opt level: O1

Var Js::Int64ToVar(int64 value,void *user_data)

{
  code *pcVar1;
  bool bVar2;
  uint64 uVar3;
  uint64 uVar4;
  undefined4 *puVar5;
  Var pvVar6;
  double value_00;
  
  if ((int)value == value) {
    pvVar6 = (Var)(value & 0xffffffffU | 0x1000000000000);
  }
  else {
    value_00 = (double)value;
    uVar3 = NumberUtilities::ToSpecial(value_00);
    bVar2 = NumberUtilities::IsNan(value_00);
    if (bVar2) {
      uVar4 = NumberUtilities::ToSpecial(value_00);
      if (uVar4 != 0xfff8000000000000) {
        uVar4 = NumberUtilities::ToSpecial(value_00);
        if (uVar4 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
      }
    }
    pvVar6 = (Var)(uVar3 ^ 0xfffc000000000000);
  }
  return pvVar6;
}

Assistant:

Js::Var Int64ToVar(int64 value, void* user_data)
{
    Context* ctx = (Context*)user_data;
    return JavascriptNumber::ToVar(value, ctx->scriptContext);
}